

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.c
# Opt level: O0

Heap * CreateHeap(Raw raw,Size userSize)

{
  Chuck *chuck;
  Chuck *chuck_00;
  Chuck *endingOverhead;
  Size initialSize;
  Chuck *firstChuck;
  int i;
  Heap *heap;
  Size userSize_local;
  Raw raw_local;
  
  if (0x458 < userSize) {
    for (firstChuck._4_4_ = 0; firstChuck._4_4_ < 0x40; firstChuck._4_4_ = firstChuck._4_4_ + 1) {
      *(undefined8 *)((long)raw + (long)firstChuck._4_4_ * 8 + 0x210) = 0;
      *(undefined8 *)((long)raw + (long)firstChuck._4_4_ * 8 + 0x10) = 0;
    }
    chuck = (Chuck *)((long)raw + 0x40c);
    *(uint *)((long)raw + 0x410) = *(uint *)((long)raw + 0x410) & 0xfffffffe | 1;
    SetSize(chuck,userSize - 0x42c & 0xfffffffffffffff8);
    SetUsed(chuck,'\0');
    SetPrev(chuck,(Chuck *)0x0);
    SetNext(chuck,(Chuck *)0x0);
    chuck_00 = GetHigher(chuck);
    SetSize(chuck_00,0x18);
    SetUsed(chuck_00,'\x01');
    SetPrev(chuck_00,chuck_00);
    SetNext(chuck_00,chuck_00);
    *(undefined8 *)((long)raw + 8) = 0;
    *(undefined8 *)raw = 0;
    MoveIn((Heap *)raw,chuck);
    return (Heap *)raw;
  }
  __assert_fail("userSize > sizeof(Heap) + sizeof(Chuck) * 3",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Source/Heap.c"
                ,9,"Heap *CreateHeap(Raw, Size)");
}

Assistant:

Heap *CreateHeap(Raw raw, Size userSize) {
    assert(userSize > sizeof(Heap) + sizeof(Chuck) * 3);
    Heap *heap = (Heap *) raw;
    for (int i = 0; i < 64; i += 1) {
        heap->exact[i] = heap->sorted[i] = NULL;
    }
    Chuck *firstChuck =
            (Chuck *) ((Bytes) raw + sizeof(Heap) - sizeof(uint32_t));
    firstChuck->lowerUsed = 1;
    Size initialSize =
            (userSize - sizeof(Heap) - sizeof(Chuck) - sizeof(uint32_t))
                    >> 3u << 3u;
    SetSize(firstChuck, initialSize);
    SetUsed(firstChuck, 0);
    SetPrev(firstChuck, NULL);
    SetNext(firstChuck, NULL);
    Chuck *endingOverhead = GetHigher(firstChuck);
    SetSize(endingOverhead, sizeof(Chuck));
    SetUsed(endingOverhead, 1);
    SetPrev(endingOverhead, endingOverhead);
    SetNext(endingOverhead, endingOverhead);
    heap->head = heap->last = NULL;
    MoveIn(heap, firstChuck);
    return heap;
}